

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::base_sink<std::mutex>::set_formatter
          (base_sink<std::mutex> *this,
          unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *sink_formatter)

{
  mutex_type *in_RSI;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *in_stack_ffffffffffffffd0;
  undefined1 local_20 [32];
  
  CLI::std::lock_guard<std::mutex>::lock_guard(in_RDI,in_RSI);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::unique_ptr
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)in_RDI,
             (unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)in_RSI);
  (**(code **)((long)&in_RDI->_M_device[1].super___mutex_base._M_mutex + 0x20))(in_RDI,local_20);
  CLI::std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            (in_stack_ffffffffffffffd0);
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x6bacc6);
  return;
}

Assistant:

void SPDLOG_INLINE
spdlog::sinks::base_sink<Mutex>::set_formatter(std::unique_ptr<spdlog::formatter> sink_formatter) {
    std::lock_guard<Mutex> lock(mutex_);
    set_formatter_(std::move(sink_formatter));
}